

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_setup_frame(AV1_COMP *cpi)

{
  SequenceHeader *seq_params;
  BLOCK_SIZE sb_size;
  int iVar1;
  AV1_COMMON *cm_00;
  RefCntBuffer *pRVar2;
  long *in_RDI;
  RefCntBuffer *primary_ref_buf;
  AV1_COMMON *cm;
  AV1_COMMON *in_stack_ffffffffffffffe8;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  iVar1 = frame_is_intra_only(cm_00);
  if (((iVar1 != 0) || ((*(byte *)((long)in_RDI + 0x3c176) & 1) != 0)) ||
     ((*(byte *)((long)in_RDI + 0x42d8f) & 1) != 0)) {
    av1_setup_past_independence((AV1_COMMON *)0x23369e);
  }
  if ((((cm_00->current_frame).frame_type == '\0') && ((int)in_RDI[0x782c] != 0)) ||
     (iVar1 = frame_is_sframe(cm_00), iVar1 != 0)) {
    if (*(int *)(*in_RDI + 0x178) == 0) {
      seq_params = (SequenceHeader *)in_RDI[0x8401];
      sb_size = av1_select_sb_size((AV1EncoderConfig *)(in_RDI + 0x8464),(int)in_RDI[0x77f7],
                                   *(int *)((long)in_RDI + 0x3bfbc),*(int *)(*in_RDI + 0xc75c));
      set_sb_size(seq_params,sb_size);
    }
  }
  else {
    in_stack_ffffffffffffffe8 = (AV1_COMMON *)get_primary_ref_frame_buf(in_stack_ffffffffffffffe8);
    if (in_stack_ffffffffffffffe8 == (AV1_COMMON *)0x0) {
      av1_setup_past_independence((AV1_COMMON *)0x233749);
      *(undefined1 *)((long)in_RDI + 0x409b9) = 1;
      *(undefined1 *)((long)in_RDI + 0x409ba) = 1;
    }
    else {
      memcpy((void *)in_RDI[0x8402],(in_stack_ffffffffffffffe8->quant_params).giqmatrix[1][1] + 0x12
             ,0x52fc);
    }
  }
  memset((void *)(in_RDI[0x780d] + 0x5bc),0,0x10);
  pRVar2 = get_primary_ref_frame_buf(in_stack_ffffffffffffffe8);
  in_RDI[0x780c] = (long)pRVar2;
  *(undefined4 *)(in_RDI + 0x10266) = 0;
  return;
}

Assistant:

void av1_setup_frame(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  // Set up entropy context depending on frame type. The decoder mandates
  // the use of the default context, index 0, for keyframes and inter
  // frames where the error_resilient_mode or intra_only flag is set. For
  // other inter-frames the encoder currently uses only two contexts;
  // context 1 for ALTREF frames and context 0 for the others.

  if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
      cpi->ext_flags.use_primary_ref_none) {
    av1_setup_past_independence(cm);
  }

  if ((cm->current_frame.frame_type == KEY_FRAME && cm->show_frame) ||
      frame_is_sframe(cm)) {
    if (!cpi->ppi->seq_params_locked) {
      set_sb_size(cm->seq_params,
                  av1_select_sb_size(&cpi->oxcf, cm->width, cm->height,
                                     cpi->ppi->number_spatial_layers));
    }
  } else {
    const RefCntBuffer *const primary_ref_buf = get_primary_ref_frame_buf(cm);
    if (primary_ref_buf == NULL) {
      av1_setup_past_independence(cm);
      cm->seg.update_map = 1;
      cm->seg.update_data = 1;
    } else {
      *cm->fc = primary_ref_buf->frame_context;
    }
  }

  av1_zero(cm->cur_frame->interp_filter_selected);
  cm->prev_frame = get_primary_ref_frame_buf(cm);
  cpi->vaq_refresh = 0;
}